

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HEkk.cpp
# Opt level: O0

HighsInt __thiscall
HEkk::addBadBasisChange
          (HEkk *this,HighsInt row_out,HighsInt variable_out,HighsInt variable_in,
          BadBasisChangeReason reason,bool taboo)

{
  size_type sVar1;
  reference pvVar2;
  int in_ECX;
  int in_EDX;
  int in_ESI;
  value_type *in_RDI;
  BadBasisChangeReason in_R8D;
  byte in_R9B;
  HighsSimplexBadBasisChangeRecord record_1;
  HighsSimplexBadBasisChangeRecord *record;
  HighsInt Ix;
  HighsInt bad_basis_change_num;
  HighsInt num_bad_basis_change;
  undefined4 in_stack_ffffffffffffffb0;
  int local_28;
  int local_24;
  
  sVar1 = std::
          vector<HighsSimplexBadBasisChangeRecord,_std::allocator<HighsSimplexBadBasisChangeRecord>_>
          ::size((vector<HighsSimplexBadBasisChangeRecord,_std::allocator<HighsSimplexBadBasisChangeRecord>_>
                  *)(in_RDI + 0x1c4));
  local_24 = -1;
  local_28 = 0;
  do {
    if ((int)sVar1 <= local_28) {
LAB_0076dd73:
      if (local_24 < 0) {
        std::
        vector<HighsSimplexBadBasisChangeRecord,_std::allocator<HighsSimplexBadBasisChangeRecord>_>
        ::push_back((vector<HighsSimplexBadBasisChangeRecord,_std::allocator<HighsSimplexBadBasisChangeRecord>_>
                     *)(CONCAT44(in_ESI,CONCAT31((int3)((uint)in_stack_ffffffffffffffb0 >> 8),in_R9B
                                                )) & 0xffffffffffffff01),in_RDI);
        sVar1 = std::
                vector<HighsSimplexBadBasisChangeRecord,_std::allocator<HighsSimplexBadBasisChangeRecord>_>
                ::size((vector<HighsSimplexBadBasisChangeRecord,_std::allocator<HighsSimplexBadBasisChangeRecord>_>
                        *)(in_RDI + 0x1c4));
        local_24 = (int)sVar1 + -1;
      }
      else {
        pvVar2 = std::
                 vector<HighsSimplexBadBasisChangeRecord,_std::allocator<HighsSimplexBadBasisChangeRecord>_>
                 ::operator[]((vector<HighsSimplexBadBasisChangeRecord,_std::allocator<HighsSimplexBadBasisChangeRecord>_>
                               *)(in_RDI + 0x1c4),(long)local_24);
        pvVar2->taboo = (bool)(in_R9B & 1);
      }
      return local_24;
    }
    pvVar2 = std::
             vector<HighsSimplexBadBasisChangeRecord,_std::allocator<HighsSimplexBadBasisChangeRecord>_>
             ::operator[]((vector<HighsSimplexBadBasisChangeRecord,_std::allocator<HighsSimplexBadBasisChangeRecord>_>
                           *)(in_RDI + 0x1c4),(long)local_28);
    if ((((pvVar2->row_out == in_ESI) && (pvVar2->variable_out == in_EDX)) &&
        (pvVar2->variable_in == in_ECX)) && (pvVar2->reason == in_R8D)) {
      local_24 = local_28;
      goto LAB_0076dd73;
    }
    local_28 = local_28 + 1;
  } while( true );
}

Assistant:

HighsInt HEkk::addBadBasisChange(const HighsInt row_out,
                                 const HighsInt variable_out,
                                 const HighsInt variable_in,
                                 const BadBasisChangeReason reason,
                                 const bool taboo) {
  assert(0 <= row_out && row_out <= lp_.num_row_);
  assert(0 <= variable_out && variable_out <= lp_.num_col_ + lp_.num_row_);
  if (variable_in >= 0) {
    assert(0 <= variable_in && variable_in <= lp_.num_col_ + lp_.num_row_);
  } else {
    assert(variable_in == -1);
  }
  // Check that this is not already on the list
  const HighsInt num_bad_basis_change = bad_basis_change_.size();
  HighsInt bad_basis_change_num = -1;
  for (HighsInt Ix = 0; Ix < num_bad_basis_change; Ix++) {
    HighsSimplexBadBasisChangeRecord& record = bad_basis_change_[Ix];
    if (record.row_out == row_out && record.variable_out == variable_out &&
        record.variable_in == variable_in && record.reason == reason) {
      bad_basis_change_num = Ix;
      break;
    }
  }
  if (bad_basis_change_num < 0) {
    // Not on the list so create record
    HighsSimplexBadBasisChangeRecord record;
    record.taboo = taboo;
    record.row_out = row_out;
    record.variable_out = variable_out;
    record.variable_in = variable_in;
    record.reason = reason;
    bad_basis_change_.push_back(record);
    bad_basis_change_num = bad_basis_change_.size() - 1;
  } else {
    // On the list so just update whether it is taboo
    bad_basis_change_[bad_basis_change_num].taboo = taboo;
  }
  return bad_basis_change_num;
}